

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

ValueType * HighsHashTree<int,_void>::find_recurse(NodePtr node,uint64_t hash,int hashPos,int *key)

{
  uint8_t pos;
  bool bVar1;
  Type TVar2;
  int iVar3;
  int pos_00;
  int *piVar4;
  BranchNode *pBVar5;
  int *in_RCX;
  ulong fullHash;
  int in_EDX;
  NodePtr in_RSI;
  uintptr_t in_RDI;
  int location;
  BranchNode *branch;
  InnerLeaf<4> *leaf_4;
  InnerLeaf<3> *leaf_3;
  InnerLeaf<2> *leaf_2;
  InnerLeaf<1> *leaf_1;
  ListNode *iter;
  ListLeaf *leaf;
  int startPos;
  uint8_t in_stack_ffffffffffffff6f;
  int *in_stack_ffffffffffffff70;
  BranchNode *pBVar6;
  undefined8 in_stack_ffffffffffffff78;
  InnerLeaf<4> *in_stack_ffffffffffffff88;
  ListLeaf *local_40;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  NodePtr local_10;
  ValueType *local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pos_00 = in_EDX;
  local_10.ptrAndType = in_RDI;
  TVar2 = NodePtr::getType(&local_10);
  fullHash = (ulong)TVar2;
  switch(fullHash) {
  case 0:
    local_8 = (ValueType *)0x0;
    break;
  case 1:
    local_40 = NodePtr::getListLeaf(&local_10);
    do {
      piVar4 = HighsHashTableEntry<int,_void>::key(&(local_40->first).entry);
      if (*piVar4 == *in_RCX) {
        piVar4 = HighsHashTableEntry<int,_void>::value(&(local_40->first).entry);
        return piVar4;
      }
      local_40 = (ListLeaf *)(local_40->first).next;
    } while (local_40 != (ListLeaf *)0x0);
    local_8 = (ValueType *)0x0;
    break;
  case 2:
    NodePtr::getInnerLeafSizeClass1(&local_10);
    local_8 = InnerLeaf<1>::find_entry
                        ((InnerLeaf<1> *)in_stack_ffffffffffffff88,fullHash,iVar3,
                         in_stack_ffffffffffffff70);
    break;
  case 3:
    NodePtr::getInnerLeafSizeClass2(&local_10);
    local_8 = InnerLeaf<2>::find_entry
                        ((InnerLeaf<2> *)in_stack_ffffffffffffff88,fullHash,iVar3,
                         in_stack_ffffffffffffff70);
    break;
  case 4:
    NodePtr::getInnerLeafSizeClass3(&local_10);
    local_8 = InnerLeaf<3>::find_entry
                        ((InnerLeaf<3> *)in_stack_ffffffffffffff88,fullHash,iVar3,
                         in_stack_ffffffffffffff70);
    break;
  case 5:
    NodePtr::getInnerLeafSizeClass4(&local_10);
    local_8 = InnerLeaf<4>::find_entry
                        (in_stack_ffffffffffffff88,fullHash,iVar3,in_stack_ffffffffffffff70);
    break;
  case 6:
    pBVar5 = NodePtr::getBranchNode(&local_10);
    pBVar6 = pBVar5;
    pos = get_hash_chunk(in_RSI.ptrAndType,pos_00);
    bVar1 = Occupation::test(&pBVar6->occupation,pos);
    if (!bVar1) {
      return (ValueType *)0x0;
    }
    pBVar6 = pBVar5;
    get_hash_chunk(in_RSI.ptrAndType,pos_00);
    iVar3 = Occupation::num_set_until(&pBVar6->occupation,in_stack_ffffffffffffff6f);
    local_10.ptrAndType = pBVar5->child[iVar3 + -1].ptrAndType;
    pos_00 = pos_00 + 1;
  default:
    local_8 = find_recurse(in_RSI,CONCAT44(pos_00,in_stack_ffffffffffffffe0),
                           (int)((ulong)in_RCX >> 0x20),
                           (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
  }
  return local_8;
}

Assistant:

static const ValueType* find_recurse(NodePtr node, uint64_t hash, int hashPos,
                                       const K& key) {
    int startPos = hashPos;
    switch (node.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (iter->entry.key() == key) return &iter->entry.value();
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        if (!branch->occupation.test(get_hash_chunk(hash, hashPos)))
          return nullptr;
        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        node = branch->child[location];
        ++hashPos;
      }
    }

    assert(hashPos > startPos);

    return find_recurse(node, hash, hashPos, key);
  }